

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O2

string_type * __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
::render(string_type *__return_storage_ptr__,
        basic_mustache<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
        *this,context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              *ctx)

{
  _Any_data local_1b8;
  code *local_1a8;
  code *local_1a0;
  basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> ss;
  
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&ss);
  local_1b8._8_8_ = 0;
  local_1a0 = Catch::clara::std::
              _Function_handler<void_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:959:16)>
              ::_M_invoke;
  local_1a8 = Catch::clara::std::
              _Function_handler<void_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:959:16)>
              ::_M_manager;
  local_1b8._M_unused._0_8_ = (undefined8)(wostringstream *)&ss;
  render(this,(render_handler *)&local_1b8,ctx,true);
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_1b8);
  std::__cxx11::wstringbuf::str();
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

string_type render(context_internal<string_type>& ctx) {
        std::basic_ostringstream<typename string_type::value_type> ss;
        render([&ss](const string_type& str) {
            ss << str;
        }, ctx);
        return ss.str();
    }